

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testJacobiEigenSolver.cpp
# Opt level: O2

void testMinMaxEigenValue<Imath_3_2::Matrix44<float>>(Matrix44<float> *A)

{
  Vec4 *pVVar1;
  float *pfVar2;
  long lVar3;
  BaseType_conflict2 BVar4;
  TV maxV;
  TV minV;
  Matrix44<float> V;
  TV S;
  Matrix44<float> A1;
  Matrix44<float> U;
  Vec4 local_140 [16];
  Vec4 local_130 [16];
  float local_120 [16];
  Matrix44 local_e0 [64];
  Matrix44 local_a0 [64];
  undefined4 local_60;
  undefined8 local_5c;
  undefined8 uStack_54;
  undefined4 local_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined4 local_38;
  undefined8 local_34;
  undefined8 uStack_2c;
  undefined4 local_24;
  
  local_60 = 0x3f800000;
  local_5c = 0;
  uStack_54 = 0;
  local_4c = 0x3f800000;
  local_48 = 0;
  uStack_40 = 0;
  local_38 = 0x3f800000;
  local_34 = 0;
  uStack_2c = 0;
  local_24 = 0x3f800000;
  local_120[0] = 1.0;
  local_120[1] = 0.0;
  local_120[2] = 0.0;
  local_120[3] = 0.0;
  local_120[4] = 0.0;
  local_120[5] = 1.0;
  local_120[6] = 0.0;
  local_120[7] = 0.0;
  local_120[8] = 0.0;
  local_120[9] = 0.0;
  local_120[10] = 1.0;
  local_120[0xb] = 0.0;
  local_120[0xc] = 0.0;
  local_120[0xd] = 0.0;
  local_120[0xe] = 0.0;
  local_120[0xf] = 1.0;
  BVar4 = computeThreshold<Imath_3_2::Matrix44<float>>(A);
  Imath_3_2::Matrix44<float>::Matrix44((Matrix44<float> *)local_a0,A);
  Imath_3_2::minEigenVector<Imath_3_2::Matrix44<float>,Imath_3_2::Vec4<float>>(local_a0,local_130);
  Imath_3_2::Matrix44<float>::Matrix44((Matrix44<float> *)local_e0,A);
  Imath_3_2::maxEigenVector<Imath_3_2::Matrix44<float>,Imath_3_2::Vec4<float>>(local_e0,local_140);
  Imath_3_2::Matrix44<float>::Matrix44((Matrix44<float> *)local_a0,A);
  lVar3 = 0;
  Imath_3_2::jacobiSVD<float>
            (local_a0,(Matrix44 *)&local_60,(Vec4 *)local_e0,(Matrix44 *)local_120,1.1920929e-07,
             false);
  while( true ) {
    if (lVar3 == 0x10) {
      return;
    }
    if (BVar4 <= ABS(*(float *)(local_130 + lVar3) - local_120[lVar3 + 3])) break;
    pVVar1 = local_140 + lVar3;
    pfVar2 = local_120 + lVar3;
    lVar3 = lVar3 + 4;
    if (BVar4 <= ABS(*(float *)pVVar1 - *pfVar2)) {
      __assert_fail("abs (maxV[i] - V[i][0]) < threshold",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testJacobiEigenSolver.cpp"
                    ,0x98,"void testMinMaxEigenValue(const TM &) [TM = Imath_3_2::Matrix44<float>]")
      ;
    }
  }
  __assert_fail("abs (minV[i] - V[i][dim - 1]) < threshold",
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testJacobiEigenSolver.cpp"
                ,0x97,"void testMinMaxEigenValue(const TM &) [TM = Imath_3_2::Matrix44<float>]");
}

Assistant:

void
testMinMaxEigenValue (const TM& A)
{
    typedef typename TM::BaseVecType TV;
    typedef typename TM::BaseType    T;

    TV minV, maxV, S;
    TM U, V;

    const T threshold = computeThreshold (A);

    {
        TM A1 (A);
        minEigenVector (A1, minV);
        TM A2 (A);
        maxEigenVector (A2, maxV);
    }
    {
        TM A3 (A);
        jacobiSVD (A3, U, S, V);
    }

    const int dim = TM::dimensions ();

    for (int i = 0; i < dim; ++i)
    {
        assert (abs (minV[i] - V[i][dim - 1]) < threshold);
        assert (abs (maxV[i] - V[i][0]) < threshold);
    }
}